

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

string * __thiscall Kernel::Term::functionName_abi_cxx11_(Term *this)

{
  string *psVar1;
  
  psVar1 = Signature::functionName_abi_cxx11_(DAT_00b521b0,this->_functor);
  return psVar1;
}

Assistant:

const std::string& Term::functionName() const
{
#if VDEBUG
  static std::string nonexisting("<function does not exists>");
  if (_functor>=static_cast<unsigned>(env.signature->functions())) {
    return nonexisting;
  }
#endif

  return env.signature->functionName(_functor);
}